

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerSafe::StopEventLoopThread(CommissionerSafe *this)

{
  bool bVar1;
  event_base *peVar2;
  undefined1 *__stat_loc;
  undefined1 local_78 [24];
  CommissionerSafe *local_60;
  AsyncRequest local_58;
  undefined1 local_28 [8];
  promise<void> pro;
  CommissionerSafe *this_local;
  
  pro._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
        )(__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )this;
  std::promise<void>::promise((promise<void> *)local_28);
  peVar2 = EventBaseHolder::Get(&this->mEventBase);
  if (((peVar2 != (event_base *)0x0) &&
      (bVar1 = std::operator!=(&this->mImpl,(nullptr_t)0x0), bVar1)) &&
     (bVar1 = std::thread::joinable(&this->mEventThread), bVar1)) {
    local_78._16_8_ = local_28;
    local_60 = this;
    std::function<void()>::
    function<ot::commissioner::CommissionerSafe::StopEventLoopThread()::__0,void>
              ((function<void()> *)&local_58,(anon_class_16_2_20c91408 *)(local_78 + 0x10));
    PushAsyncRequest(this,&local_58);
    std::function<void_()>::~function(&local_58);
    __stat_loc = local_28;
    std::promise<void>::get_future((promise<void> *)local_78);
    std::__basic_future<void>::wait((__basic_future<void> *)local_78,__stat_loc);
    std::future<void>::~future((future<void> *)local_78);
    std::thread::join();
  }
  std::promise<void>::~promise((promise<void> *)local_28);
  return;
}

Assistant:

void CommissionerSafe::StopEventLoopThread(void)
{
    std::promise<void> pro;

    VerifyOrExit(mEventBase.Get() != nullptr && mImpl != nullptr);
    VerifyOrExit(mEventThread.joinable());

    // Send `Stop` to the event loop to break it from inside.
    // This makes sure the event loop has been started when we
    // trying to break it.
    PushAsyncRequest([&pro, this]() {
        event_base_loopbreak(mEventBase.Get());
        pro.set_value();
    });

    pro.get_future().wait();

    mEventThread.join();

exit:
    return;
}